

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O2

void xc_available_functional_numbers(int *list)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  int *piVar4;
  
  uVar1 = xc_number_of_functionals();
  uVar2 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  piVar4 = &xc_functional_keys[0].number;
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    list[uVar2] = *piVar4;
    piVar4 = piVar4 + 0x41;
  }
  qsort(list,(long)(int)uVar1,4,compare_int);
  return;
}

Assistant:

void xc_available_functional_numbers(int *list)
{
  int ii, N;
  N=xc_number_of_functionals();
  for(ii=0;ii<N;ii++){
    list[ii]=xc_functional_keys[ii].number;
  }
  /* Sort list by id */
  qsort(list, N, sizeof(int), compare_int);
}